

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_uncompress2mem(char *filename,FILE *diskfile,int hdl)

{
  char *pcVar1;
  int in_EDX;
  FILE *in_RSI;
  char *in_RDI;
  int *in_stack_00000010;
  int status;
  size_t finalsize;
  size_t *in_stack_00000060;
  _func_void_ptr_void_ptr_size_t *in_stack_00000068;
  size_t *in_stack_00000070;
  char **in_stack_00000078;
  FILE *in_stack_00000080;
  char *in_stack_00000088;
  int *in_stack_000000a0;
  size_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  size_t *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar2 = 0;
  pcVar1 = strstr(in_RDI,".Z");
  if (pcVar1 == (char *)0x0) {
    uncompress2mem(in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070,
                   in_stack_00000068,in_stack_00000060,in_stack_000000a0);
  }
  else {
    zuncompress2mem(in_RDI,in_RSI,(char **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                    in_stack_ffffffffffffffe0,
                    (_func_void_ptr_void_ptr_size_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),
                    in_stack_ffffffffffffffd0,in_stack_00000010);
  }
  memTable[in_EDX].currentpos = 0;
  memTable[in_EDX].fitsfilesize = (LONGLONG)in_stack_ffffffffffffffe0;
  return iVar2;
}

Assistant:

int mem_uncompress2mem(char *filename, FILE *diskfile, int hdl)
{
/*
  lower level routine to uncompress a file into memory.  The file
  has already been opened and the memory buffer has been allocated.
*/

  size_t finalsize;
  int status;
  /* uncompress file into memory */
  status = 0;

    if (strstr(filename, ".Z")) {
         zuncompress2mem(filename, diskfile,
		 memTable[hdl].memaddrptr,   /* pointer to memory address */
		 memTable[hdl].memsizeptr,   /* pointer to size of memory */
		 realloc,                     /* reallocation function */
		 &finalsize, &status);        /* returned file size nd status*/
#if HAVE_BZIP2
    } else if (strstr(filename, ".bz2")) {
        bzip2uncompress2mem(filename, diskfile, hdl, &finalsize, &status);
#endif
    } else {
         uncompress2mem(filename, diskfile,
		 memTable[hdl].memaddrptr,   /* pointer to memory address */
		 memTable[hdl].memsizeptr,   /* pointer to size of memory */
		 realloc,                     /* reallocation function */
		 &finalsize, &status);        /* returned file size nd status*/
    } 

  memTable[hdl].currentpos = 0;           /* save starting position */
  memTable[hdl].fitsfilesize=finalsize;   /* and initial file size  */
  return status;
}